

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::fix_up_interpolant_access_chain
          (CompilerMSL *this,uint32_t *ops,uint32_t length)

{
  Variant *pVVar1;
  bool bVar2;
  uint32_t value;
  uint uVar3;
  SPIRVariable *var;
  const_iterator cVar4;
  SPIRType *pSVar5;
  SPIRType *type;
  ulong uVar6;
  SPIRConstant *pSVar7;
  SPIRType *type_00;
  CompilerError *this_00;
  size_t sVar8;
  uint32_t local_34;
  
  var = Compiler::maybe_get_backing_variable((Compiler *)this,ops[2]);
  if (var != (SPIRVariable *)0x0) {
    local_34 = (var->super_IVariant).self.id;
    cVar4 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->pull_model_inputs)._M_h,&local_34);
    if (cVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
      pSVar5 = Compiler::get_variable_data_type((Compiler *)this,var);
      type = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + *ops);
      bVar2 = Compiler::has_extended_decoration
                        ((Compiler *)this,ops[2],SPIRVCrossDecorationInterfaceMemberIndex);
      if (bVar2) {
        value = Compiler::get_extended_decoration
                          ((Compiler *)this,ops[2],SPIRVCrossDecorationInterfaceMemberIndex);
      }
      else {
        if (pSVar5->basetype != Struct) {
          __assert_fail("var_type.basetype == SPIRType::Struct",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x233a,
                        "void spirv_cross::CompilerMSL::fix_up_interpolant_access_chain(const uint32_t *, uint32_t)"
                       );
        }
        pSVar7 = Variant::get<spirv_cross::SPIRConstant>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            ops[(pSVar5->array).super_VectorView<unsigned_int>.buffer_size + 3]);
        value = Compiler::get_extended_member_decoration
                          ((Compiler *)this,(var->super_IVariant).self.id,(pSVar7->m).c[0].r[0].u32,
                           SPIRVCrossDecorationInterfaceMemberIndex);
      }
      if (3 < length) {
        sVar8 = 0;
        type_00 = pSVar5;
        do {
          bVar2 = Compiler::is_vector((Compiler *)this,type_00);
          if (((bVar2) && (bVar2 = Compiler::is_array((Compiler *)this,type_00), !bVar2)) &&
             (bVar2 = Compiler::is_scalar((Compiler *)this,type), bVar2)) {
            Compiler::set_extended_decoration
                      ((Compiler *)this,ops[1],SPIRVCrossDecorationInterpolantComponentExpr,
                       ops[sVar8 + 3]);
            break;
          }
          uVar6 = (ulong)ops[sVar8 + 3];
          if ((((this->super_CompilerGLSL).super_Compiler.ir.ids.
                super_VectorView<spirv_cross::Variant>.buffer_size <= uVar6) ||
              (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr,
              pVVar1[uVar6].type != TypeConstant)) ||
             (pSVar7 = Variant::get<spirv_cross::SPIRConstant>(pVVar1 + uVar6),
             pSVar7->specialization == true)) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (this_00,
                       "Trying to dynamically index into an array interface variable using pull-model interpolation. This is currently unsupported."
                      );
            __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          uVar3 = (type_00->parent_type).id;
          if (uVar3 == 0) {
            if (type_00->basetype == Struct) {
              uVar3 = (type_00->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                      [(pSVar7->m).c[0].r[0].u32].id;
              goto LAB_0020de45;
            }
          }
          else {
LAB_0020de45:
            type_00 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + uVar3);
          }
          bVar2 = Compiler::has_extended_decoration
                            ((Compiler *)this,ops[2],SPIRVCrossDecorationInterfaceMemberIndex);
          if ((bVar2) || (sVar8 != (pSVar5->array).super_VectorView<unsigned_int>.buffer_size)) {
            value = value + (pSVar7->m).c[0].r[0].u32;
          }
          sVar8 = sVar8 + 1;
        } while ((ulong)length - 3 != sVar8);
      }
      Compiler::set_extended_decoration
                ((Compiler *)this,ops[1],SPIRVCrossDecorationInterfaceMemberIndex,value);
    }
  }
  return;
}

Assistant:

void CompilerMSL::fix_up_interpolant_access_chain(const uint32_t *ops, uint32_t length)
{
	auto *var = maybe_get_backing_variable(ops[2]);
	if (!var || !pull_model_inputs.count(var->self))
		return;
	// Get the base index.
	uint32_t interface_index;
	auto &var_type = get_variable_data_type(*var);
	auto &result_type = get<SPIRType>(ops[0]);
	auto *type = &var_type;
	if (has_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex))
	{
		interface_index = get_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex);
	}
	else
	{
		// Assume an access chain into a struct variable.
		assert(var_type.basetype == SPIRType::Struct);
		auto &c = get<SPIRConstant>(ops[3 + var_type.array.size()]);
		interface_index =
		    get_extended_member_decoration(var->self, c.scalar(), SPIRVCrossDecorationInterfaceMemberIndex);
	}
	// Accumulate indices. We'll have to skip over the one for the struct, if present, because we already accounted
	// for that getting the base index.
	for (uint32_t i = 3; i < length; ++i)
	{
		if (is_vector(*type) && !is_array(*type) && is_scalar(result_type))
		{
			// We don't want to combine the next index. Actually, we need to save it
			// so we know to apply a swizzle to the result of the interpolation.
			set_extended_decoration(ops[1], SPIRVCrossDecorationInterpolantComponentExpr, ops[i]);
			break;
		}

		auto *c = maybe_get<SPIRConstant>(ops[i]);
		if (!c || c->specialization)
			SPIRV_CROSS_THROW("Trying to dynamically index into an array interface variable using pull-model "
			                  "interpolation. This is currently unsupported.");

		if (type->parent_type)
			type = &get<SPIRType>(type->parent_type);
		else if (type->basetype == SPIRType::Struct)
			type = &get<SPIRType>(type->member_types[c->scalar()]);

		if (!has_extended_decoration(ops[2], SPIRVCrossDecorationInterfaceMemberIndex) &&
		    i - 3 == var_type.array.size())
			continue;

		interface_index += c->scalar();
	}
	// Save this to the access chain itself so we can recover it later when calling an interpolation function.
	set_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex, interface_index);
}